

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts3EvalNextRow(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  u8 *pbEof;
  int *pnList;
  char *pcVar1;
  u8 uVar2;
  u8 uVar3;
  Fts3Expr *pFVar4;
  Fts3Expr *pFVar5;
  Fts3Phrase *pFVar6;
  Fts3Table *pTab;
  long lVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  sqlite3_int64 sVar13;
  char *__dest;
  int iVar14;
  char **ppcVar15;
  ulong uVar16;
  Fts3Expr *pFVar17;
  TokenDoclist *pTVar18;
  long lVar19;
  int iVar20;
  long in_FS_OFFSET;
  bool bVar21;
  char *pR;
  char *pL;
  u8 bEof;
  TokenDoclist a [4];
  char *local_d8;
  char *local_d0;
  char *local_c8;
  int iStack_c0;
  u8 local_b9;
  TokenDoclist local_b8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*pRc != 0) || (pExpr->bEof != '\0')) goto LAB_001ce3f6;
  pbEof = &pExpr->bEof;
  uVar2 = pCsr->bDesc;
  pExpr->bStart = '\x01';
  switch(pExpr->eType) {
  case 1:
  case 3:
    pFVar4 = pExpr->pLeft;
    pFVar5 = pExpr->pRight;
    if (pFVar4->bDeferred == '\0') {
      uVar3 = pFVar5->bDeferred;
      fts3EvalNextRow(pCsr,pFVar4,pRc);
      if (uVar3 == '\0') {
        fts3EvalNextRow(pCsr,pFVar5,pRc);
        while (((pFVar4->bEof == '\0' && (pFVar5->bEof == '\0')) && (*pRc == 0))) {
          lVar19 = pFVar4->iDocid;
          lVar7 = pFVar5->iDocid;
          if (lVar19 == lVar7) break;
          iVar12 = -(uint)(lVar19 != lVar7);
          if (lVar7 < lVar19) {
            iVar12 = 1;
          }
          iVar9 = -iVar12;
          if (uVar2 == '\0') {
            iVar9 = iVar12;
          }
          pFVar17 = pFVar4;
          if (-1 < iVar9) {
            pFVar17 = pFVar5;
          }
          fts3EvalNextRow(pCsr,pFVar17,pRc);
        }
        pExpr->iDocid = pFVar4->iDocid;
        bVar21 = true;
        if (pFVar4->bEof == '\0') {
          bVar21 = pFVar5->bEof != '\0';
        }
        pExpr->bEof = bVar21;
        if ((pExpr->eType == 1) && (bVar21 != false)) {
          pFVar6 = pFVar5->pPhrase;
          if ((pFVar6->doclist).aAll != (char *)0x0) {
            while ((*pRc == 0 && (pFVar5->bEof == '\0'))) {
              memset((pFVar6->doclist).pList,0,(long)(pFVar6->doclist).nList);
              fts3EvalNextRow(pCsr,pFVar5,pRc);
            }
          }
          pFVar6 = pFVar4->pPhrase;
          if ((pFVar6 != (Fts3Phrase *)0x0) && ((pFVar6->doclist).aAll != (char *)0x0)) {
            while ((*pRc == 0 && (pFVar4->bEof == '\0'))) {
              memset((pFVar6->doclist).pList,0,(long)(pFVar6->doclist).nList);
              fts3EvalNextRow(pCsr,pFVar4,pRc);
            }
          }
          pFVar4->bEof = '\x01';
          pFVar5->bEof = '\x01';
        }
      }
      else {
        pExpr->iDocid = pFVar4->iDocid;
        pExpr->bEof = pFVar4->bEof;
      }
    }
    else {
      fts3EvalNextRow(pCsr,pFVar5,pRc);
      pExpr->iDocid = pFVar5->iDocid;
      pExpr->bEof = pFVar5->bEof;
    }
    break;
  case 2:
    pFVar4 = pExpr->pLeft;
    pFVar5 = pExpr->pRight;
    if (pFVar5->bStart == '\0') {
      fts3EvalNextRow(pCsr,pFVar5,pRc);
    }
    fts3EvalNextRow(pCsr,pFVar4,pRc);
    if (pFVar4->bEof == '\0') {
      while ((*pRc == 0 && (pFVar5->bEof == '\0'))) {
        bVar21 = pFVar4->iDocid < pFVar5->iDocid;
        if (uVar2 == '\0') {
          bVar21 = pFVar5->iDocid < pFVar4->iDocid;
        }
        if (!bVar21) break;
        fts3EvalNextRow(pCsr,pFVar5,pRc);
      }
    }
    pExpr->iDocid = pFVar4->iDocid;
    pExpr->bEof = pFVar4->bEof;
    break;
  case 4:
    pFVar4 = pExpr->pLeft;
    pFVar5 = pExpr->pRight;
    iVar12 = 1;
    if (pFVar4->iDocid <= pFVar5->iDocid) {
      iVar12 = -(uint)(pFVar4->iDocid != pFVar5->iDocid);
    }
    uVar10 = -(uint)(uVar2 != '\0') | 1;
    pFVar17 = pFVar4;
    if (pFVar5->bEof == '\0') {
      iVar12 = iVar12 * uVar10;
      if (((pFVar4->bEof != '\0') || (-1 < iVar12)) &&
         ((pFVar17 = pFVar5, pFVar4->bEof == '\0' && (iVar12 < 1)))) {
        fts3EvalNextRow(pCsr,pFVar4,pRc);
      }
    }
    fts3EvalNextRow(pCsr,pFVar17,pRc);
    if (pFVar4->bEof == '\0') {
      bVar21 = false;
    }
    else {
      bVar21 = pFVar5->bEof != '\0';
    }
    *pbEof = bVar21;
    lVar19 = pFVar4->iDocid;
    if (pFVar5->bEof == '\0') {
      lVar7 = pFVar5->iDocid;
      iVar12 = 1;
      if (lVar19 <= lVar7) {
        iVar12 = -(uint)(lVar19 != lVar7);
      }
      if ((pFVar4->bEof != '\0') || (-1 < (int)(iVar12 * uVar10))) {
        pExpr->iDocid = lVar7;
        break;
      }
    }
    pExpr->iDocid = lVar19;
    break;
  default:
    pFVar6 = pExpr->pPhrase;
    if ((pFVar6->doclist).bFreeList != 0) {
      sqlite3_free((pFVar6->doclist).pList);
    }
    (pFVar6->doclist).pList = (char *)0x0;
    pnList = &(pFVar6->doclist).nList;
    (pFVar6->doclist).nList = 0;
    (pFVar6->doclist).bFreeList = 0;
    pTab = (Fts3Table *)(pCsr->base).pVtab;
    if (pFVar6->bIncr == 0) {
      if ((pCsr->bDesc == pTab->bDescIdx) || (iVar12 = (pFVar6->doclist).nAll, iVar12 == 0)) {
        fts3EvalDlPhraseNext(pTab,&pFVar6->doclist,pbEof);
      }
      else {
        sqlite3Fts3DoclistPrev
                  ((uint)pTab->bDescIdx,(pFVar6->doclist).aAll,iVar12,&(pFVar6->doclist).pNextDocid,
                   &(pFVar6->doclist).iDocid,pnList,pbEof);
        (pFVar6->doclist).pList = (pFVar6->doclist).pNextDocid;
      }
      iVar12 = 0;
    }
    else {
      local_b9 = '\0';
      if (pFVar6->nToken == 1) {
        iVar9 = sqlite3Fts3MsrIncrNext
                          (pTab,pFVar6->aToken[0].pSegcsr,&(pFVar6->doclist).iDocid,
                           &(pFVar6->doclist).pList,pnList);
        if ((pFVar6->doclist).pList == (char *)0x0) {
          local_b9 = '\x01';
        }
      }
      else {
        uVar2 = pCsr->bDesc;
        local_b8.bIgnore = 0;
        local_b8._4_4_ = 0;
        local_b8.iDocid = 0;
        local_b8.pList = (char *)0x0;
        local_b8.nList = 0;
        local_b8._28_4_ = 0;
        local_98 = 0;
        uStack_90 = 0;
        local_88 = 0;
        uStack_80 = 0;
        local_78 = 0;
        uStack_70 = 0;
        local_68 = 0;
        uStack_60 = 0;
        local_58 = 0;
        uStack_50 = 0;
        iVar9 = 0;
        local_48 = 0;
        uStack_40 = 0;
        uVar10 = -(uint)(uVar2 != '\0') | 1;
        do {
          bVar21 = local_b9 != '\0';
          if (bVar21) goto LAB_001cebd8;
          if ((iVar9 == 0) && (0 < pFVar6->nToken)) {
            sVar13 = 0;
            lVar19 = 1;
            pTVar18 = &local_b8;
            bVar8 = false;
            do {
              iVar9 = incrPhraseTokenNext(pTab,pFVar6,(int)lVar19 + -1,pTVar18,&local_b9);
              if (pTVar18->bIgnore == 0) {
                if (bVar8) {
                  bVar8 = true;
                  iVar12 = -(uint)(sVar13 != pTVar18->iDocid);
                  if (pTVar18->iDocid < sVar13) {
                    iVar12 = 1;
                  }
                  iVar20 = -iVar12;
                  if (uVar2 == '\0') {
                    iVar20 = iVar12;
                  }
                  if (-1 < iVar20) goto LAB_001ce908;
                }
                sVar13 = pTVar18->iDocid;
                bVar8 = true;
              }
LAB_001ce908:
              if ((iVar9 != 0) || (pFVar6->nToken <= lVar19)) break;
              lVar19 = lVar19 + 1;
              pTVar18 = pTVar18 + 1;
            } while (local_b9 == '\0');
          }
          else {
            sVar13 = 0;
          }
          iVar12 = pFVar6->nToken;
          if (0 < iVar12) {
            iVar20 = 0;
            do {
              if (((iVar9 == 0) && (local_b9 == '\0')) && ((&local_b8)[iVar20].bIgnore == 0)) {
                pTVar18 = &local_b8 + iVar20;
                iVar12 = -(uint)((&local_b8)[iVar20].iDocid != sVar13);
                lVar19 = sVar13;
                if (sVar13 < (&local_b8)[iVar20].iDocid) {
                  iVar12 = 1;
                }
                while (sVar13 = lVar19, (int)(iVar12 * uVar10) < 0) {
                  iVar9 = incrPhraseTokenNext(pTab,pFVar6,iVar20,pTVar18,&local_b9);
                  sVar13 = pTVar18->iDocid;
                  iVar12 = 1;
                  if (sVar13 <= lVar19) {
                    iVar12 = -(uint)(sVar13 != lVar19);
                  }
                  iVar14 = 0;
                  if ((int)(iVar12 * uVar10) < 1) {
                    sVar13 = lVar19;
                    iVar14 = iVar20;
                  }
                  iVar20 = iVar14;
                  if (((iVar9 != 0) || (local_b9 != '\0')) || ((&local_b8)[iVar20].bIgnore != 0))
                  break;
                  pTVar18 = &local_b8 + iVar20;
                  iVar12 = 1;
                  lVar19 = sVar13;
                  if ((&local_b8)[iVar20].iDocid <= sVar13) {
                    iVar12 = -(uint)((&local_b8)[iVar20].iDocid != sVar13);
                  }
                }
              }
              iVar20 = iVar20 + 1;
              iVar12 = pFVar6->nToken;
            } while (iVar20 < iVar12);
          }
          if (local_b9 == '\0') {
            iVar12 = (&iStack_c0)[(long)iVar12 * 8];
            iVar20 = sqlite3_initialize();
            if (iVar20 == 0) {
              __dest = (char *)sqlite3Malloc((long)iVar12 + 8);
            }
            else {
              __dest = (char *)0x0;
            }
            bVar8 = false;
            iVar20 = 0;
            if (__dest == (char *)0x0) {
              iVar12 = 1;
            }
            else {
              memcpy(__dest,(&local_c8)[(long)pFVar6->nToken * 4],(long)(iVar12 + 1));
              pcVar1 = __dest + iVar12;
              pcVar1[0] = '\0';
              pcVar1[1] = '\0';
              pcVar1[2] = '\0';
              pcVar1[3] = '\0';
              pcVar1[4] = '\0';
              pcVar1[5] = '\0';
              pcVar1[6] = '\0';
              pcVar1[7] = '\0';
              uVar16 = (ulong)(uint)pFVar6->nToken;
              iVar12 = 0;
              if (1 < pFVar6->nToken) {
                lVar19 = 0;
                iVar20 = -1;
                ppcVar15 = &local_b8.pList;
                iVar12 = 0;
                do {
                  iVar14 = iVar12;
                  if (((TokenDoclist *)(ppcVar15 + -2))->bIgnore == 0) {
                    local_c8 = *ppcVar15;
                    local_d8 = __dest;
                    local_d0 = __dest;
                    iVar11 = fts3PoslistPhraseMerge
                                       (&local_d8,(int)uVar16 + iVar20,0,1,&local_c8,&local_d0);
                    iVar14 = (int)local_d8 - (int)__dest;
                    if (iVar11 == 0) break;
                  }
                  lVar19 = lVar19 + 1;
                  uVar16 = (ulong)pFVar6->nToken;
                  iVar20 = iVar20 + -1;
                  ppcVar15 = ppcVar15 + 4;
                  iVar12 = iVar14;
                } while (lVar19 < (long)(uVar16 - 1));
                iVar20 = (int)lVar19;
              }
              if (iVar20 == pFVar6->nToken + -1) {
                (pFVar6->doclist).iDocid = sVar13;
                (pFVar6->doclist).pList = __dest;
                (pFVar6->doclist).nList = iVar12;
                (pFVar6->doclist).bFreeList = 1;
                iVar12 = 3;
                bVar8 = false;
              }
              else {
                sqlite3_free(__dest);
                iVar12 = 0;
                bVar8 = true;
              }
            }
            if (bVar8) goto LAB_001cea6a;
          }
          else {
LAB_001cea6a:
            iVar12 = 0;
          }
        } while (iVar12 == 0);
        if (iVar12 == 3) {
          bVar21 = true;
        }
LAB_001cebd8:
        iVar12 = 7;
        if (!bVar21) goto LAB_001cebf3;
      }
      *pbEof = local_b9;
      iVar12 = iVar9;
    }
LAB_001cebf3:
    *pRc = iVar12;
    pExpr->iDocid = (pFVar6->doclist).iDocid;
  }
LAB_001ce3f6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void fts3EvalNextRow(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pExpr,                /* Expr. to advance to next matching row */
  int *pRc                        /* IN/OUT: Error code */
){
  if( *pRc==SQLITE_OK && pExpr->bEof==0 ){
    int bDescDoclist = pCsr->bDesc;         /* Used by DOCID_CMP() macro */
    pExpr->bStart = 1;

    switch( pExpr->eType ){
      case FTSQUERY_NEAR:
      case FTSQUERY_AND: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;
        assert( !pLeft->bDeferred || !pRight->bDeferred );

        if( pLeft->bDeferred ){
          /* LHS is entirely deferred. So we assume it matches every row.
          ** Advance the RHS iterator to find the next row visited. */
          fts3EvalNextRow(pCsr, pRight, pRc);
          pExpr->iDocid = pRight->iDocid;
          pExpr->bEof = pRight->bEof;
        }else if( pRight->bDeferred ){
          /* RHS is entirely deferred. So we assume it matches every row.
          ** Advance the LHS iterator to find the next row visited. */
          fts3EvalNextRow(pCsr, pLeft, pRc);
          pExpr->iDocid = pLeft->iDocid;
          pExpr->bEof = pLeft->bEof;
        }else{
          /* Neither the RHS or LHS are deferred. */
          fts3EvalNextRow(pCsr, pLeft, pRc);
          fts3EvalNextRow(pCsr, pRight, pRc);
          while( !pLeft->bEof && !pRight->bEof && *pRc==SQLITE_OK ){
            sqlite3_int64 iDiff = DOCID_CMP(pLeft->iDocid, pRight->iDocid);
            if( iDiff==0 ) break;
            if( iDiff<0 ){
              fts3EvalNextRow(pCsr, pLeft, pRc);
            }else{
              fts3EvalNextRow(pCsr, pRight, pRc);
            }
          }
          pExpr->iDocid = pLeft->iDocid;
          pExpr->bEof = (pLeft->bEof || pRight->bEof);
          if( pExpr->eType==FTSQUERY_NEAR && pExpr->bEof ){
            assert( pRight->eType==FTSQUERY_PHRASE );
            if( pRight->pPhrase->doclist.aAll ){
              Fts3Doclist *pDl = &pRight->pPhrase->doclist;
              while( *pRc==SQLITE_OK && pRight->bEof==0 ){
                memset(pDl->pList, 0, pDl->nList);
                fts3EvalNextRow(pCsr, pRight, pRc);
              }
            }
            if( pLeft->pPhrase && pLeft->pPhrase->doclist.aAll ){
              Fts3Doclist *pDl = &pLeft->pPhrase->doclist;
              while( *pRc==SQLITE_OK && pLeft->bEof==0 ){
                memset(pDl->pList, 0, pDl->nList);
                fts3EvalNextRow(pCsr, pLeft, pRc);
              }
            }
            pRight->bEof = pLeft->bEof = 1;
          }
        }
        break;
      }

      case FTSQUERY_OR: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;
        sqlite3_int64 iCmp = DOCID_CMP(pLeft->iDocid, pRight->iDocid);

        assert_fts3_nc( pLeft->bStart || pLeft->iDocid==pRight->iDocid );
        assert_fts3_nc( pRight->bStart || pLeft->iDocid==pRight->iDocid );

        if( pRight->bEof || (pLeft->bEof==0 && iCmp<0) ){
          fts3EvalNextRow(pCsr, pLeft, pRc);
        }else if( pLeft->bEof || iCmp>0 ){
          fts3EvalNextRow(pCsr, pRight, pRc);
        }else{
          fts3EvalNextRow(pCsr, pLeft, pRc);
          fts3EvalNextRow(pCsr, pRight, pRc);
        }

        pExpr->bEof = (pLeft->bEof && pRight->bEof);
        iCmp = DOCID_CMP(pLeft->iDocid, pRight->iDocid);
        if( pRight->bEof || (pLeft->bEof==0 &&  iCmp<0) ){
          pExpr->iDocid = pLeft->iDocid;
        }else{
          pExpr->iDocid = pRight->iDocid;
        }

        break;
      }

      case FTSQUERY_NOT: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;

        if( pRight->bStart==0 ){
          fts3EvalNextRow(pCsr, pRight, pRc);
          assert( *pRc!=SQLITE_OK || pRight->bStart );
        }

        fts3EvalNextRow(pCsr, pLeft, pRc);
        if( pLeft->bEof==0 ){
          while( !*pRc
              && !pRight->bEof
              && DOCID_CMP(pLeft->iDocid, pRight->iDocid)>0
          ){
            fts3EvalNextRow(pCsr, pRight, pRc);
          }
        }
        pExpr->iDocid = pLeft->iDocid;
        pExpr->bEof = pLeft->bEof;
        break;
      }

      default: {
        Fts3Phrase *pPhrase = pExpr->pPhrase;
        fts3EvalInvalidatePoslist(pPhrase);
        *pRc = fts3EvalPhraseNext(pCsr, pPhrase, &pExpr->bEof);
        pExpr->iDocid = pPhrase->doclist.iDocid;
        break;
      }
    }
  }
}